

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# user.c
# Opt level: O3

int linux_evfilt_user_copyout(kevent *dst,int nevents,filter *filt,knote *src,void *ptr)

{
  byte *pbVar1;
  intptr_t iVar2;
  void *pvVar3;
  short sVar4;
  unsigned_short uVar5;
  uint uVar6;
  int iVar7;
  ssize_t sVar8;
  int *piVar9;
  ushort uVar10;
  uint64_t cur;
  undefined1 auStack_18 [8];
  
  sVar4 = (src->kev).filter;
  uVar5 = (src->kev).flags;
  uVar6 = (src->kev).fflags;
  iVar2 = (src->kev).data;
  pvVar3 = (src->kev).udata;
  dst->ident = (src->kev).ident;
  dst->filter = sVar4;
  dst->flags = uVar5;
  dst->fflags = uVar6;
  dst->data = iVar2;
  dst->udata = pvVar3;
  pbVar1 = (byte *)((long)&dst->fflags + 3);
  *pbVar1 = *pbVar1 & 0x3e;
  uVar10 = (src->kev).flags;
  if ((uVar10 & 0x20) != 0) {
    pbVar1 = (byte *)((long)&(src->kev).fflags + 3);
    *pbVar1 = *pbVar1 & 0xfe;
  }
  if ((uVar10 & 0xb0) != 0) {
    sVar8 = read((src->field_10).kn_timerfd,auStack_18,8);
    if (sVar8 < 0) {
      piVar9 = __errno_location();
      if (*piVar9 != 0xb) {
        return -1;
      }
    }
    else if (sVar8 != 8) {
      return -1;
    }
  }
  uVar10 = (src->kev).flags;
  iVar7 = 0;
  if ((char)uVar10 < '\0') {
    pbVar1 = (byte *)((long)&(src->kev).fflags + 3);
    *pbVar1 = *pbVar1 & 0xfe;
    iVar7 = knote_disable(filt,src);
    uVar10 = (src->kev).flags;
  }
  if ((uVar10 & 0x10) != 0) {
    iVar7 = knote_delete(filt,src);
  }
  return iVar7 >> 0x1f | 1;
}

Assistant:

int
linux_evfilt_user_copyout(struct kevent *dst, UNUSED int nevents, struct filter *filt,
    struct knote *src, void *ptr UNUSED)
{
    memcpy(dst, &src->kev, sizeof(*dst));
    dst->fflags &= ~NOTE_FFCTRLMASK;     //FIXME: Not sure if needed
    dst->fflags &= ~NOTE_TRIGGER;
    if (src->kev.flags & EV_CLEAR)
        src->kev.fflags &= ~NOTE_TRIGGER;
    if (src->kev.flags & (EV_DISPATCH | EV_CLEAR | EV_ONESHOT)) {
        if (eventfd_lower(src->kn_eventfd) < 0)
            return (-1);
    }

    if (src->kev.flags & EV_DISPATCH)
        src->kev.fflags &= ~NOTE_TRIGGER;

    if (knote_copyout_flag_actions(filt, src) < 0) return -1;

    return (1);
}